

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  QChar *pQVar1;
  char16_t *pcVar2;
  CutResult CVar3;
  char16_t *pcVar4;
  long lVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar6.m_data = *(p->a).a.a;
  QVar6.m_size = 3;
  QAbstractConcatenable::convertFromUtf8(QVar6,out);
  lVar5 = (long)(p->a).a.b.m_length;
  if (lVar5 != 0) {
    pQVar1 = *out;
    pcVar2 = (p->a).a.b.m_string.d.ptr;
    local_40 = (long)(p->a).a.b.m_offset;
    local_48 = lVar5;
    CVar3 = QtPrivate::QContainerImplHelper::mid((p->a).a.b.m_string.d.size,&local_40,&local_48);
    pcVar4 = (char16_t *)0x0;
    if (CVar3 != Null) {
      pcVar4 = pcVar2 + local_40;
    }
    memcpy(pQVar1,pcVar4,lVar5 * 2);
    *out = *out + lVar5;
  }
  QVar7.m_data = *(p->a).b;
  QVar7.m_size = 1;
  QAbstractConcatenable::convertFromUtf8(QVar7,out);
  lVar5 = (long)(p->b).m_length;
  if (lVar5 != 0) {
    pQVar1 = *out;
    pcVar2 = (p->b).m_string.d.ptr;
    local_40 = (long)(p->b).m_offset;
    local_48 = lVar5;
    CVar3 = QtPrivate::QContainerImplHelper::mid((p->b).m_string.d.size,&local_40,&local_48);
    pcVar4 = (char16_t *)0x0;
    if (CVar3 != Null) {
      pcVar4 = pcVar2 + local_40;
    }
    memcpy(pQVar1,pcVar4,lVar5 * 2);
    *out = *out + lVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }